

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_function_decl(gvisitor_t *self,gnode_function_decl_t *node)

{
  long *plVar1;
  long lVar2;
  size_t sVar3;
  gnode_compound_stmt_t *pgVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint uVar7;
  undefined8 in_RAX;
  void *pvVar8;
  symboltable_t *table;
  uint16_t uVar9;
  ulong uVar10;
  long lVar11;
  gnode_t *pgVar12;
  ulong uVar13;
  gnode_var_t *p;
  undefined8 uVar14;
  undefined4 uVar15;
  
  pgVar12 = *(gnode_t **)((*self->data)[2] + -8 + **self->data * 8);
  check_access_storage_specifiers(self,&node->base,pgVar12->tag,node->access,node->storage);
  node->env = pgVar12;
  plVar1 = *self->data;
  lVar2 = plVar1[1];
  if (*plVar1 == lVar2) {
    lVar11 = 8;
    if (lVar2 != 0) {
      lVar11 = lVar2 * 2;
    }
    plVar1[1] = lVar11;
    pvVar8 = realloc((void *)plVar1[2],lVar11 << 3);
    *(void **)(*self->data + 0x10) = pvVar8;
  }
  plVar1 = *self->data;
  lVar2 = *plVar1;
  *plVar1 = lVar2 + 1;
  *(gnode_function_decl_t **)(plVar1[2] + lVar2 * 8) = node;
  table = symboltable_create(SYMTABLE_TAG_FUNC);
  symboltable_enter_scope(table);
  node->symtable = table;
  if ((node->params != (gnode_r *)0x0) && (sVar3 = node->params->n, sVar3 != 0)) {
    uVar13 = 0;
    do {
      if (uVar13 < node->params->n) {
        pgVar12 = node->params->p[uVar13];
      }
      else {
        pgVar12 = (gnode_t *)0x0;
      }
      *(gnode_function_decl_t **)(pgVar12 + 1) = node;
      _Var5 = symboltable_insert(table,*(char **)&pgVar12[1].block_length,pgVar12);
      if (_Var5) {
        uVar6 = symboltable_local_index(table);
        *(short *)&pgVar12[1].token.length = (short)uVar6;
      }
      else {
        report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar12,"Parameter %s redeclared.",
                     *(undefined8 *)&pgVar12[1].block_length);
      }
      uVar13 = uVar13 + 1;
    } while (sVar3 != uVar13);
  }
  uVar15 = (undefined4)((ulong)in_RAX >> 0x20);
  pgVar4 = node->block;
  if (pgVar4 != (gnode_compound_stmt_t *)0x0) {
    if (pgVar4->stmts == (gnode_r *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = pgVar4->stmts->n;
    }
    if (uVar13 != 0) {
      uVar10 = 0;
      do {
        if (uVar10 < pgVar4->stmts->n) {
          pgVar12 = pgVar4->stmts->p[uVar10];
        }
        else {
          pgVar12 = (gnode_t *)0x0;
        }
        gvisit(self,pgVar12);
        uVar15 = (undefined4)((ulong)in_RAX >> 0x20);
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
  }
  if (node->params == (gnode_r *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint16_t)node->params->n;
  }
  uVar6 = symboltable_exit_scope(table,(uint32_t *)0x0);
  if (uVar6 < 0xc9) {
    node->nlocals = (short)uVar6 - uVar9;
    node->nparams = uVar9;
  }
  else {
    uVar14 = CONCAT44(uVar15,uVar6);
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "Maximum number of local variables reached in function %s (max:%d found:%d).",
                 node->identifier,200,uVar14);
    uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
  }
  if (node->uplist == (gupvalue_r *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (uint)node->uplist->n;
  }
  if (200 < uVar7) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "Maximum number of upvalues reached in function %s (max:%d found:%d).",
                 node->identifier,200,CONCAT44(uVar15,uVar7));
  }
  lVar2 = **self->data;
  if (lVar2 != 0) {
    **self->data = lVar2 + -1;
  }
  return;
}

Assistant:

static void visit_function_decl (gvisitor_t *self, gnode_function_decl_t *node) {
    DEBUG_CODEGEN("visit_function_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    DECLARE_CONTEXT();
    bool is_class_ctx = OBJECT_ISA_CLASS(context_object);

    // create new function object
    uint16_t nparams = (node->params) ? (uint16_t)marray_size(*node->params) : 0;
    gravity_function_t *f = gravity_function_new((is_class_ctx) ? NULL : GET_VM(), node->identifier,
                                                 nparams, node->nlocals, 0, (void *)ircode_create(node->nlocals+nparams));

    // check if f is a special constructor function (init)
    // name must be CLASS_CONSTRUCTOR_NAME and context_object must be a class
    bool is_constructor = (string_cmp(node->identifier, CLASS_CONSTRUCTOR_NAME) == 0) && (is_class_ctx);

    // loop at each param to save name and check for default values
    // loop from 1 in order to skip implicit self argument
    size_t len = gnode_array_size(node->params);
    for (size_t i=1; i<len; ++i) {
        gnode_var_t *param = (gnode_var_t *)gnode_array_get(node->params, i);
        gravity_value_t name = VALUE_FROM_CSTRING(NULL, param->identifier);
        marray_push(gravity_value_t, f->pname, name);
        
        if (node->has_defaults) {
            // LOOP for each node->params[i]->expr and convert literal to gravity_value_t
            // if expr is NULL then compute value as UNDEFINED (and add each one to f->defaults preserving the index)
            gnode_literal_expr_t *literal = (gnode_literal_expr_t *)param->expr;
            gravity_value_t value = (literal) ? literal2value(literal) : VALUE_FROM_UNDEFINED;
            marray_push(gravity_value_t, f->pvalue, value);
        }
    }
    
    CONTEXT_PUSH(f);

    if (is_constructor) {
        // reserve first four instructions that could be later filled with a CALL to $init
        // see process_constructor for more information
        ircode_t *code = (ircode_t *)f->bytecode;
        if (!code) {report_error(self, (gnode_t *)node, "Invalid code context."); return;}
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
    }

    // process inner block
    ircode_t *code = (ircode_t *)f->bytecode;
    if (node->block) {
        gnode_array_each(node->block->stmts, {
            // process node
            visit(val);
            // reset temp registers after each node
            ircode_register_temps_clear(code);
        });
    }

    // check for upvalues
    if (node->uplist) f->nupvalues = (uint16_t)gnode_array_size(node->uplist);

    // remove current function
    CONTEXT_POP();

    // check for ircode errors
    if (ircode_iserror((ircode_t *)f->bytecode))
        report_error(self, (gnode_t *)node, "Maximum number of available registers used in function %s.", f->identifier);

    // store function in current context
    store_declaration(self, (gravity_object_t *)f, (node->storage == TOK_KEY_STATIC), node);

    // convert ircode to bytecode (postpone optimization of the constructor)
	if (!is_constructor) gravity_optimizer(f, self->bflag);
}